

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O1

void stbtt__v_prefilter(uchar *pixels,int w,int h,int stride_in_bytes,uint kernel_width)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  byte *pbVar11;
  ulong uVar12;
  uchar buffer [8];
  byte local_50 [8];
  ulong local_48;
  int local_3c;
  int local_38;
  int local_34;
  
  local_50[0] = 0;
  local_50[1] = 0;
  local_50[2] = 0;
  local_50[3] = 0;
  local_50[4] = 0;
  local_50[5] = 0;
  local_50[6] = 0;
  local_50[7] = 0;
  if (0 < w) {
    local_48 = (ulong)(h - kernel_width);
    lVar5 = (long)stride_in_bytes;
    uVar12 = (ulong)((h - kernel_width) + 1);
    local_34 = 0;
    local_3c = h;
    local_38 = w;
    do {
      memset(local_50,0,(ulong)kernel_width);
      switch(kernel_width) {
      case 2:
        if ((int)local_48 < 0) {
LAB_00135d5e:
          uVar7 = 0;
          uVar4 = 0;
        }
        else {
          uVar7 = 0;
          uVar4 = 0;
          pbVar11 = pixels;
          do {
            bVar1 = *pbVar11;
            bVar2 = local_50[(uint)uVar7 & 7];
            local_50[(uint)uVar7 + 2 & 7] = bVar1;
            uVar3 = (int)uVar4 + ((uint)bVar1 - (uint)bVar2);
            uVar4 = (ulong)uVar3;
            *pbVar11 = (byte)(uVar3 >> 1);
            uVar7 = uVar7 + 1;
            pbVar11 = pbVar11 + lVar5;
          } while (uVar12 != uVar7);
        }
        break;
      case 3:
        if ((int)local_48 < 0) goto LAB_00135d5e;
        uVar7 = 0;
        uVar4 = 0;
        pbVar11 = pixels;
        do {
          bVar1 = *pbVar11;
          bVar2 = local_50[(uint)uVar7 & 7];
          local_50[(uint)uVar7 + 3 & 7] = bVar1;
          uVar4 = (ulong)((int)uVar4 + ((uint)bVar1 - (uint)bVar2));
          *pbVar11 = (byte)(uVar4 / 3);
          uVar7 = uVar7 + 1;
          pbVar11 = pbVar11 + lVar5;
        } while (uVar12 != uVar7);
        break;
      case 4:
        if ((int)local_48 < 0) goto LAB_00135d5e;
        uVar7 = 0;
        uVar4 = 0;
        pbVar11 = pixels;
        do {
          bVar1 = *pbVar11;
          uVar10 = (ulong)((uint)uVar7 & 7);
          local_50[uVar10 ^ 4] = bVar1;
          uVar3 = (int)uVar4 + ((uint)bVar1 - (uint)local_50[uVar10]);
          uVar4 = (ulong)uVar3;
          *pbVar11 = (byte)(uVar3 >> 2);
          uVar7 = uVar7 + 1;
          pbVar11 = pbVar11 + lVar5;
        } while (uVar12 != uVar7);
        break;
      case 5:
        if ((int)local_48 < 0) goto LAB_00135d5e;
        uVar7 = 0;
        uVar4 = 0;
        pbVar11 = pixels;
        do {
          bVar1 = *pbVar11;
          bVar2 = local_50[(uint)uVar7 & 7];
          local_50[(uint)uVar7 + 5 & 7] = bVar1;
          uVar4 = (ulong)((int)uVar4 + ((uint)bVar1 - (uint)bVar2));
          *pbVar11 = (byte)(uVar4 / 5);
          uVar7 = uVar7 + 1;
          pbVar11 = pbVar11 + lVar5;
        } while (uVar12 != uVar7);
        break;
      default:
        if ((int)local_48 < 0) {
          uVar7 = 0;
          uVar4 = 0;
        }
        else {
          uVar7 = 0;
          uVar4 = 0;
          pbVar11 = pixels;
          do {
            bVar1 = *pbVar11;
            bVar2 = local_50[(uint)uVar7 & 7];
            local_50[kernel_width + (uint)uVar7 & 7] = bVar1;
            uVar3 = (int)uVar4 + ((uint)bVar1 - (uint)bVar2);
            uVar4 = (ulong)uVar3;
            *pbVar11 = (byte)(uVar3 / kernel_width);
            uVar7 = uVar7 + 1;
            pbVar11 = pbVar11 + lVar5;
          } while (uVar12 != uVar7);
        }
      }
      iVar6 = (int)uVar7;
      iVar9 = local_3c - iVar6;
      if (iVar9 != 0 && iVar6 <= local_3c) {
        lVar8 = (long)iVar6;
        pbVar11 = pixels + lVar5 * lVar8;
        do {
          if (*pbVar11 != 0) {
            __assert_fail("pixels[i*stride_in_bytes] == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/bernhardfritz[P]mariobreaksout/lib/piksel/lib/stb/include/stb/stb_truetype.h"
                          ,0xf5e,
                          "void stbtt__v_prefilter(unsigned char *, int, int, int, unsigned int)");
          }
          uVar3 = (int)uVar4 - (uint)local_50[(uint)lVar8 & 7];
          uVar4 = (ulong)uVar3;
          *pbVar11 = (byte)(uVar3 / kernel_width);
          lVar8 = lVar8 + 1;
          pbVar11 = pbVar11 + lVar5;
          iVar9 = iVar9 + -1;
        } while (iVar9 != 0);
      }
      pixels = pixels + 1;
      local_34 = local_34 + 1;
    } while (local_34 != local_38);
  }
  return;
}

Assistant:

static void stbtt__v_prefilter(unsigned char *pixels, int w, int h, int stride_in_bytes, unsigned int kernel_width)
{
   unsigned char buffer[STBTT_MAX_OVERSAMPLE];
   int safe_h = h - kernel_width;
   int j;
   STBTT_memset(buffer, 0, STBTT_MAX_OVERSAMPLE); // suppress bogus warning from VS2013 -analyze
   for (j=0; j < w; ++j) {
      int i;
      unsigned int total;
      STBTT_memset(buffer, 0, kernel_width);

      total = 0;

      // make kernel_width a constant in common cases so compiler can optimize out the divide
      switch (kernel_width) {
         case 2:
            for (i=0; i <= safe_h; ++i) {
               total += pixels[i*stride_in_bytes] - buffer[i & STBTT__OVER_MASK];
               buffer[(i+kernel_width) & STBTT__OVER_MASK] = pixels[i*stride_in_bytes];
               pixels[i*stride_in_bytes] = (unsigned char) (total / 2);
            }
            break;
         case 3:
            for (i=0; i <= safe_h; ++i) {
               total += pixels[i*stride_in_bytes] - buffer[i & STBTT__OVER_MASK];
               buffer[(i+kernel_width) & STBTT__OVER_MASK] = pixels[i*stride_in_bytes];
               pixels[i*stride_in_bytes] = (unsigned char) (total / 3);
            }
            break;
         case 4:
            for (i=0; i <= safe_h; ++i) {
               total += pixels[i*stride_in_bytes] - buffer[i & STBTT__OVER_MASK];
               buffer[(i+kernel_width) & STBTT__OVER_MASK] = pixels[i*stride_in_bytes];
               pixels[i*stride_in_bytes] = (unsigned char) (total / 4);
            }
            break;
         case 5:
            for (i=0; i <= safe_h; ++i) {
               total += pixels[i*stride_in_bytes] - buffer[i & STBTT__OVER_MASK];
               buffer[(i+kernel_width) & STBTT__OVER_MASK] = pixels[i*stride_in_bytes];
               pixels[i*stride_in_bytes] = (unsigned char) (total / 5);
            }
            break;
         default:
            for (i=0; i <= safe_h; ++i) {
               total += pixels[i*stride_in_bytes] - buffer[i & STBTT__OVER_MASK];
               buffer[(i+kernel_width) & STBTT__OVER_MASK] = pixels[i*stride_in_bytes];
               pixels[i*stride_in_bytes] = (unsigned char) (total / kernel_width);
            }
            break;
      }

      for (; i < h; ++i) {
         STBTT_assert(pixels[i*stride_in_bytes] == 0);
         total -= buffer[i & STBTT__OVER_MASK];
         pixels[i*stride_in_bytes] = (unsigned char) (total / kernel_width);
      }

      pixels += 1;
   }
}